

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *c;
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  unsigned_long *puVar4;
  int lenght;
  ulong uVar5;
  ulong *c_00;
  SAttribute attr;
  string<unsigned_long> s;
  SAttribute local_88;
  string<unsigned_long> local_68;
  ulong *local_58;
  unsigned_long *local_50;
  array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *local_48;
  IIrrXMLReader<unsigned_long,_irr::io::IXMLBase> local_40;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  local_48 = &this->Attributes;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (local_48);
  local_50 = this->P;
  local_58 = local_50;
  while ((0x3e < *local_58 || ((0x4000000100002600U >> (*local_58 & 0x3f) & 1) == 0))) {
    local_58 = local_58 + 1;
    this->P = local_58;
  }
  do {
    while( true ) {
      c = this->P;
      uVar5 = *c;
      if (uVar5 < 0x3f) break;
LAB_00754905:
      puVar3 = this->P;
      uVar5 = (long)puVar3 - (long)c;
      c_00 = puVar3;
      while( true ) {
        c_00 = c_00 + 1;
        if ((*puVar3 < 0x3e) && ((0x2000000100002600U >> (*puVar3 & 0x3f) & 1) != 0)) break;
        puVar3 = puVar3 + 1;
        this->P = puVar3;
        uVar5 = uVar5 + 8;
      }
      do {
        this->P = c_00;
        uVar1 = *c_00;
        if (uVar1 == 0) {
          return;
        }
        c_00 = c_00 + 1;
      } while ((uVar1 != 0x27) && (uVar1 != 0x22));
      lenght = -1;
      puVar4 = c_00;
      do {
        this->P = puVar4;
        uVar2 = *puVar4;
        puVar4 = puVar4 + 1;
        lenght = lenght + 1;
        if (uVar2 == uVar1) break;
      } while (uVar2 != 0);
      if (uVar2 == 0) {
        return;
      }
      this->P = puVar4;
      local_88.Name.array = (unsigned_long *)0x0;
      local_88.Name.allocated = 1;
      local_88.Name.used = 1;
      local_88.Name.array = (unsigned_long *)operator_new__(8);
      *local_88.Name.array = 0;
      local_88.Value.array = (unsigned_long *)0x0;
      local_88.Value.allocated = 1;
      local_88.Value.used = 1;
      local_88.Value.array = (unsigned_long *)operator_new__(8);
      *local_88.Value.array = 0;
      core::string<unsigned_long>::string<unsigned_long>(&local_68,c,(s32)(uVar5 >> 3));
      core::string<unsigned_long>::operator=(&local_88.Name,&local_68);
      if (local_68.array != (unsigned_long *)0x0) {
        operator_delete__(local_68.array);
      }
      core::string<unsigned_long>::string<unsigned_long>(&local_68,c_00,lenght);
      replaceSpecialCharacters
                ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)&stack0xffffffffffffffc0,
                 (string<unsigned_long> *)this);
      core::string<unsigned_long>::operator=
                (&local_88.Value,(string<unsigned_long> *)&stack0xffffffffffffffc0);
      if (local_40._vptr_IIrrXMLReader != (_func_int **)0x0) {
        operator_delete__(local_40._vptr_IIrrXMLReader);
      }
      core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
                (local_48,&local_88);
      if (local_68.array != (unsigned_long *)0x0) {
        operator_delete__(local_68.array);
      }
      if (local_88.Value.array != (unsigned_long *)0x0) {
        operator_delete__(local_88.Value.array);
      }
      if (local_88.Name.array != (unsigned_long *)0x0) {
        operator_delete__(local_88.Name.array);
      }
    }
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0x2f) {
        this->P = c + 1;
        this->IsEmptyElement = true;
LAB_00754a9b:
        puVar3 = local_58;
        if ((local_50 < local_58) && (local_58[-1] == 0x2f)) {
          puVar3 = local_58 + -1;
          this->IsEmptyElement = true;
        }
        core::string<unsigned_long>::string<unsigned_long>
                  (&local_88.Name,local_50,(s32)((ulong)((long)puVar3 - (long)local_50) >> 3));
        core::string<unsigned_long>::operator=(&this->NodeName,&local_88.Name);
        if (local_88.Name.array != (unsigned_long *)0x0) {
          operator_delete__(local_88.Name.array);
        }
        this->P = this->P + 1;
        return;
      }
      if (uVar5 == 0x3e) goto LAB_00754a9b;
      goto LAB_00754905;
    }
    this->P = c + 1;
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}